

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

int __thiscall doctest::String::compare(String *this,char *other,bool no_case)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined3 in_register_00000011;
  long lVar4;
  
  if ((this->field_0).buf[0x17] < '\0') {
    this = (String *)(this->field_0).data.ptr;
  }
  if (CONCAT31(in_register_00000011,no_case) != 0) {
    lVar4 = 0;
    while( true ) {
      cVar1 = (this->field_0).buf[lVar4];
      iVar2 = tolower((int)cVar1);
      iVar3 = tolower((int)other[lVar4]);
      if ((cVar1 == '\0') || (iVar2 != iVar3)) break;
      lVar4 = lVar4 + 1;
    }
    return iVar2 - iVar3;
  }
  iVar2 = strcmp((char *)this,other);
  return iVar2;
}

Assistant:

int String::compare(const char* other, bool no_case) const {
    if(no_case)
        return doctest::stricmp(c_str(), other);
    return std::strcmp(c_str(), other);
}